

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O0

string * RigidBodyDynamics::Utils::GetNamedBodyOriginsOverview_abi_cxx11_(Model *model)

{
  _Ios_Openmode _Var1;
  ulong uVar2;
  size_type sVar3;
  long lVar4;
  ostream *poVar5;
  long in_RSI;
  Model *in_RDI;
  Vector3d position;
  string body_name;
  uint body_id;
  VectorNd Q;
  VectorNd *in_stack_00000138;
  stringstream result;
  VectorNd *in_stack_00000148;
  Model *in_stack_00000150;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd28;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  *in_stack_fffffffffffffd38;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffffd40;
  allocator<char> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  Model *this;
  Vector3_t *this_00;
  string local_220 [36];
  uint local_1fc;
  undefined1 local_1b9 [33];
  stringstream local_198 [16];
  ostream local_188 [199];
  undefined1 in_stack_ffffffffffffff3f;
  Vector3d *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff4c;
  VectorNd *in_stack_ffffffffffffff50;
  Model *in_stack_ffffffffffffff58;
  DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  
  this_00 = (Vector3_t *)local_1b9;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,(string *)(local_1b9 + 1),_Var1);
  std::__cxx11::string::~string((string *)(local_1b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1b9);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero((Index)in_stack_fffffffffffffd38);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  UpdateKinematicsCustom(in_stack_00000150,in_stack_00000148,_result,in_stack_00000138);
  local_1fc = 0;
  while( true ) {
    uVar2 = (ulong)local_1fc;
    sVar3 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)(in_RSI + 800));
    if (sVar3 <= uVar2) break;
    Model::GetBodyName_abi_cxx11_(this,(uint)((ulong)in_RDI >> 0x20));
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      Vector3_t::Vector3_t
                (this_00,(double *)this,(double *)in_RDI,
                 (double *)CONCAT44(_Var1,in_stack_fffffffffffffd68));
      CalcBodyToBaseCoordinates
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
      poVar5 = std::operator<<(local_188,local_220);
      std::operator<<(poVar5,": ");
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose(in_stack_fffffffffffffd28);
      poVar5 = Eigen::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_220);
    local_1fc = local_1fc + 1;
  }
  std::__cxx11::stringstream::str();
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x6ba27d);
  std::__cxx11::stringstream::~stringstream(local_198);
  return (string *)this;
}

Assistant:

RBDL_DLLAPI std::string GetNamedBodyOriginsOverview (Model &model)
{
  stringstream result ("");

  VectorNd Q (VectorNd::Zero(model.dof_count));
  UpdateKinematicsCustom (model, &Q, NULL, NULL);

  for (unsigned int body_id = 0; body_id < model.mBodies.size(); body_id++) {
    std::string body_name = model.GetBodyName (body_id);

    if (body_name.size() == 0) {
      continue;
    }

    Vector3d position = CalcBodyToBaseCoordinates (model, Q, body_id, Vector3d (0.,
                        0., 0.), false);

    result << body_name << ": " << position.transpose() << endl;
  }

  return result.str();
}